

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O3

void InitRectifyMap(Mat *K,Mat *D,Mat *Knew,double xi,Size *size,RectMode mode,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Mat Ki;
  undefined1 local_658 [12];
  undefined4 uStack_64c;
  double local_618;
  double dStack_570;
  Size local_560;
  Size local_558;
  Mat local_550 [96];
  Mat local_4f0 [16];
  long local_4e0;
  long *local_4a8;
  Mat local_490 [16];
  long local_480;
  long *local_448;
  Mat local_430 [16];
  long local_420;
  long *local_3e8;
  Mat local_3d0 [16];
  long local_3c0;
  long *local_388;
  Mat local_370 [16];
  long local_360;
  long *local_328;
  Mat local_310 [16];
  double *local_300;
  Mat local_2b0 [16];
  double *local_2a0;
  Mat local_250 [16];
  double *local_240;
  Mat local_1f0 [16];
  double *local_1e0;
  long *local_190 [2];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat local_c0 [144];
  
  local_558 = *size;
  cv::Mat::create(map1,&local_558,5);
  local_560 = *size;
  cv::Mat::create(map2,&local_560,5);
  pdVar11 = *(double **)(K + 0x10);
  dVar1 = *pdVar11;
  dVar2 = pdVar11[1];
  dVar3 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar11[2];
  pdVar11 = *(double **)(D + 0x10);
  dVar6 = *pdVar11;
  dVar7 = pdVar11[1];
  dVar8 = pdVar11[2];
  dVar9 = pdVar11[3];
  cv::Mat::inv((int)local_190);
  cv::Mat::Mat(local_550);
  (**(code **)(*local_190[0] + 0x18))(local_190[0],local_190,local_550,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  iVar17 = size->height;
  if (0 < iVar17) {
    uVar18 = (ulong)(uint)size->width;
    lVar20 = 0;
    do {
      if (0 < (int)uVar18) {
        dVar14 = (double)(int)lVar20;
        auVar13._8_4_ = SUB84(dVar14,0);
        auVar13._0_8_ = dVar14;
        auVar13._12_4_ = (int)((ulong)dVar14 >> 0x20);
        lVar19 = 0;
        do {
          iVar17 = (int)lVar19;
          switch(mode) {
          case RECT_PERSPECTIVE:
            cv::Mat::Mat(local_310,local_550);
            dVar16 = (double)iVar17;
            dVar15 = local_300[1];
            dVar23 = *local_300;
            dVar25 = local_300[2];
            cv::Mat::~Mat(local_310);
            cv::Mat::Mat(local_490,local_550);
            lVar12 = *local_448;
            dVar24 = *(double *)(local_480 + lVar12);
            dVar22 = *(double *)(local_480 + 8 + lVar12);
            dVar10 = *(double *)(local_480 + 0x10 + lVar12);
            cv::Mat::~Mat(local_490);
            cv::Mat::Mat(local_4f0,local_550);
            stack0xfffffffffffff9b0 = dVar23 * dVar16 + dVar15 * dVar14 + dVar25;
            local_658._0_8_ = dVar10 + dVar24 * dVar16 + dVar22 * dVar14;
            lVar12 = *local_4a8;
            dVar15 = dVar16 * *(double *)(local_4e0 + lVar12 * 2) +
                     *(double *)(local_4e0 + 8 + lVar12 * 2) * dVar14 +
                     *(double *)(local_4e0 + 0x10 + lVar12 * 2);
            cv::Mat::~Mat(local_4f0);
            break;
          case RECT_CYLINDRICAL:
            cv::Mat::Mat(local_1f0,local_550);
            dVar15 = *local_1e0;
            dVar23 = local_1e0[1];
            dVar25 = local_1e0[2];
            cv::Mat::~Mat(local_1f0);
            cv::Mat::Mat(local_370,local_550);
            dVar25 = dVar25 + dVar15 * (double)iVar17 + dVar23 * dVar14;
            lVar12 = *local_328;
            dVar24 = (double)iVar17 * *(double *)(local_360 + lVar12) +
                     *(double *)(local_360 + 8 + lVar12) * dVar14 +
                     *(double *)(local_360 + 0x10 + lVar12) + 0.2617993877991494;
            cv::Mat::~Mat(local_370);
            dVar15 = sin(dVar24);
            dVar23 = cos(dVar25);
            local_658._0_8_ = cos(dVar24);
            local_658._0_8_ = local_658._0_8_ ^ 0x8000000000000000;
            local_658._8_4_ = SUB84(dVar23 * -dVar15,0);
            uStack_64c = (int)((ulong)(dVar23 * -dVar15) >> 0x20);
            dVar23 = sin(dVar24);
            dVar15 = sin(dVar25);
            dVar15 = dVar15 * dVar23;
            break;
          case RECT_FISHEYE:
            dVar15 = (double)iVar17;
            dVar23 = hypot(dVar15 - *(double *)(*(long *)(Knew + 0x10) + 0x10),
                           dVar14 - *(double *)
                                     (*(long *)(Knew + 0x10) + 0x10 + **(long **)(Knew + 0x48)));
            if (dVar23 < **(double **)(Knew + 0x10) || dVar23 == **(double **)(Knew + 0x10)) {
              cv::Mat::Mat(local_250,local_550);
              dVar23 = *local_240;
              dVar25 = local_240[1];
              dVar24 = local_240[2];
              cv::Mat::~Mat(local_250);
              cv::Mat::Mat(local_3d0,local_550);
              lVar12 = *local_388;
              dStack_570 = auVar13._8_8_;
              dVar22 = dVar15 * *(double *)(local_3c0 + lVar12) +
                       *(double *)(local_3c0 + 8 + lVar12) * dVar14 +
                       *(double *)(local_3c0 + 0x10 + lVar12);
              dVar24 = dVar15 * dVar23 + dVar25 * dStack_570 + dVar24;
              cv::Mat::~Mat(local_3d0);
              dVar15 = 2.0 / (dVar24 * dVar24 + dVar22 * dVar22 + 1.0);
              local_658._0_8_ = dVar15 * dVar22;
              register0x00001388 = dVar15 * dVar24;
              dVar15 = dVar15 + -1.0;
              break;
            }
            *(undefined4 *)(**(long **)(map1 + 0x48) * lVar20 + *(long *)(map1 + 0x10) + lVar19 * 4)
                 = 0xbf800000;
            fVar21 = -1.0;
            goto LAB_001041e8;
          case RECT_LONGLAT:
            cv::Mat::Mat(local_2b0,local_550);
            dVar15 = *local_2a0;
            dVar23 = local_2a0[1];
            dVar25 = local_2a0[2];
            cv::Mat::~Mat(local_2b0);
            cv::Mat::Mat(local_430,local_550);
            dVar25 = dVar25 + dVar15 * (double)iVar17 + dVar23 * dVar14;
            lVar12 = *local_3e8;
            dVar24 = (double)iVar17 * *(double *)(local_420 + lVar12) +
                     *(double *)(local_420 + 8 + lVar12) * dVar14 +
                     *(double *)(local_420 + 0x10 + lVar12);
            cv::Mat::~Mat(local_430);
            dVar15 = cos(dVar25);
            local_618 = sin(dVar25);
            local_618 = -local_618;
            dVar23 = cos(dVar24);
            local_658._8_4_ = SUB84(dVar15,0);
            local_658._0_8_ = dVar23 * local_618;
            uStack_64c = (uint)((ulong)dVar15 >> 0x20) ^ 0x80000000;
            dVar23 = sin(dVar25);
            dVar15 = sin(dVar24);
            dVar15 = dVar15 * dVar23;
            break;
          default:
            _local_658 = ZEXT816(0);
            dVar15 = 0.0;
          }
          dVar23 = SQRT(dVar15 * dVar15 +
                        local_658._8_8_ * local_658._8_8_ + local_658._0_8_ * local_658._0_8_);
          dVar15 = dVar15 / dVar23 + xi;
          auVar26._8_4_ = SUB84(dVar23,0);
          auVar26._0_8_ = dVar23;
          auVar26._12_4_ = (int)((ulong)dVar23 >> 0x20);
          auVar26 = divpd(_local_658,auVar26);
          auVar27._8_4_ = SUB84(dVar15,0);
          auVar27._0_8_ = dVar15;
          auVar27._12_4_ = (int)((ulong)dVar15 >> 0x20);
          auVar27 = divpd(auVar26,auVar27);
          dVar24 = auVar27._0_8_;
          dVar22 = auVar27._8_8_;
          dVar23 = dVar22 * dVar22 + dVar24 * dVar24;
          dVar15 = dVar6 * dVar23 + 1.0 + dVar23 * dVar23 * dVar7;
          dVar25 = ((dVar24 + dVar24) * dVar24 + dVar23) * dVar8 +
                   dVar15 * dVar24 + dVar22 * (dVar9 + dVar9) * dVar24;
          *(float *)(**(long **)(map1 + 0x48) * lVar20 + *(long *)(map1 + 0x10) + lVar19 * 4) =
               (float)(dVar2 * dVar25 +
                       (((dVar22 + dVar22) * dVar22 + dVar23) * dVar9 +
                       dVar15 * dVar22 + (dVar8 + dVar8) * dVar22 * dVar24) * dVar1 + dVar5);
          fVar21 = (float)(dVar25 * dVar3 + dVar4);
LAB_001041e8:
          *(float *)(**(long **)(map2 + 0x48) * lVar20 + *(long *)(map2 + 0x10) + lVar19 * 4) =
               fVar21;
          lVar19 = lVar19 + 1;
          uVar18 = (ulong)size->width;
        } while (lVar19 < (long)uVar18);
        iVar17 = size->height;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar17);
  }
  cv::Mat::~Mat(local_550);
  return;
}

Assistant:

void InitRectifyMap(cv::Mat K,
                    cv::Mat D,
                    cv::Mat Knew,
                    double xi,
                    cv::Size size,
                    RectMode mode,
                    cv::Mat& map1,
                    cv::Mat& map2) {
  map1.create(size, CV_32F);
  map2.create(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat Ki  = Knew.inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = 0.;
      double yc = 0.;
      double zc = 0.;

      if (mode == RECT_PERSPECTIVE) {
        xc = MatRowMul(Ki, c, r, 1., 0);
        yc = MatRowMul(Ki, c, r, 1., 1);
        zc = MatRowMul(Ki, c, r, 1., 2);
      }

      if (mode == RECT_CYLINDRICAL) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1) + MARGIN;

        xc = -sin(pp) * cos(tt);
        yc = -cos(pp);
        zc =  sin(pp) * sin(tt);
      }

      if (mode == RECT_FISHEYE) {
        if (hypot(c - Knew.at<double>(0, 2), r - Knew.at<double>(1, 2))
            > Knew.at<double>(0, 0)) {
          map1.at<float>(r,c) = -1.f;
          map2.at<float>(r,c) = -1.f;
          continue;
        }
        double ee = MatRowMul(Ki, c, r, 1., 0);
        double ff = MatRowMul(Ki, c, r, 1., 1);

        double zz = 2. / (ee * ee + ff * ff + 1.);

        xc = zz * ee;
        yc = zz * ff;
        zc = zz - 1.;
      }

      if (mode == RECT_LONGLAT) {
        double tt = MatRowMul(Ki, c, r, 1., 0);
        double pp = MatRowMul(Ki, c, r, 1., 1);

        xc = -cos(tt);
        yc = -sin(tt) * cos(pp);
        zc =  sin(tt) * sin(pp);
      }

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xi);
      double yu = ys / (zs + xi);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}